

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx *dctx,size_t maxWindowSize)

{
  ZSTD_bounds ZVar1;
  size_t max;
  size_t min;
  ZSTD_bounds bounds;
  size_t maxWindowSize_local;
  ZSTD_DCtx *dctx_local;
  
  ZVar1 = ZSTD_dParam_getBounds(ZSTD_d_windowLogMax);
  if (dctx->streamStage == zdss_init) {
    if (maxWindowSize < (ulong)(1L << ((byte)ZVar1.lowerBound & 0x3f))) {
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffd6;
    }
    else if ((ulong)(1L << ((byte)ZVar1.upperBound & 0x3f)) < maxWindowSize) {
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffd6;
    }
    else {
      dctx->maxWindowSize = maxWindowSize;
      dctx_local = (ZSTD_DCtx *)0x0;
    }
  }
  else {
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffc4;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_DCtx_setMaxWindowSize(ZSTD_DCtx* dctx, size_t maxWindowSize)
{
    ZSTD_bounds const bounds = ZSTD_dParam_getBounds(ZSTD_d_windowLogMax);
    size_t const min = (size_t)1 << bounds.lowerBound;
    size_t const max = (size_t)1 << bounds.upperBound;
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    RETURN_ERROR_IF(maxWindowSize < min, parameter_outOfBound, "");
    RETURN_ERROR_IF(maxWindowSize > max, parameter_outOfBound, "");
    dctx->maxWindowSize = maxWindowSize;
    return 0;
}